

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  cmGlobalGenerator *pcVar3;
  pointer ppcVar4;
  char *pcVar5;
  string *psVar6;
  cmSourceGroup *pcVar7;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  pointer ppcVar8;
  pointer ppcVar9;
  pointer ppcVar10;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string source;
  string linkName2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string linkName;
  string fullPath;
  string local_70;
  string linkName4;
  
  std::__cxx11::string::string((string *)&linkName,"[Targets]",(allocator *)&linkName2);
  std::__cxx11::string::string((string *)&linkName2,"virtual:/virtual",(allocator *)&source);
  AppendLinkedResource(fout,&linkName,&linkName2,VirtualFolder);
  std::__cxx11::string::~string((string *)&linkName2);
  pcVar3 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  for (ppcVar8 = (pcVar3->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppcVar8 !=
      (pcVar3->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
    this_00 = (*ppcVar8)->Makefile;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              (&targets,&(*ppcVar8)->GeneratorTargets);
    for (ppcVar4 = targets.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar4 !=
        targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
      std::__cxx11::string::string((string *)&linkName2,(string *)&linkName);
      std::__cxx11::string::append((char *)&linkName2);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar4);
      if (TVar2 < UTILITY) {
        cmGeneratorTarget::GetType(*ppcVar4);
        std::__cxx11::string::append((char *)&linkName2);
        cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar4);
        std::__cxx11::string::append((string *)&linkName2);
        std::__cxx11::string::string((string *)&source,"virtual:/virtual",(allocator *)&fullPath);
        AppendLinkedResource(fout,&linkName2,&source,VirtualFolder);
        std::__cxx11::string::~string((string *)&source);
        if (this->GenerateLinkedResources != false) {
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    (&sourceGroups,&this_00->SourceGroups);
          this_01 = *ppcVar4;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string
                    ((string *)&fullPath,"CMAKE_BUILD_TYPE",(allocator *)&linkName4);
          pcVar5 = cmMakefile::GetSafeDefinition(this_00,&fullPath);
          std::__cxx11::string::string((string *)&source,pcVar5,(allocator *)&local_70);
          cmGeneratorTarget::GetSourceFiles(this_01,&files,&source);
          std::__cxx11::string::~string((string *)&source);
          std::__cxx11::string::~string((string *)&fullPath);
          for (ppcVar9 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pcVar7 = sourceGroups.
                       super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                       super__Vector_impl_data._M_start,
              ppcVar9 !=
              files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
            psVar6 = cmSourceFile::GetFullPath(*ppcVar9,(string *)0x0);
            std::__cxx11::string::string((string *)&source,(string *)psVar6);
            pcVar7 = cmMakefile::FindSourceGroup(this_00,source._M_dataplus._M_p,&sourceGroups);
            cmSourceGroup::AssignSource(pcVar7,*ppcVar9);
            std::__cxx11::string::~string((string *)&source);
          }
          for (; pcVar7 != sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_finish; pcVar7 = pcVar7 + 1) {
            std::__cxx11::string::string((string *)&source,(string *)&linkName2);
            std::__cxx11::string::append((char *)&source);
            cmSourceGroup::GetFullName(pcVar7);
            std::__cxx11::string::append((char *)&source);
            std::__cxx11::string::string
                      ((string *)&fullPath,"virtual:/virtual",(allocator *)&linkName4);
            AppendLinkedResource(fout,&source,&fullPath,VirtualFolder);
            std::__cxx11::string::~string((string *)&fullPath);
            __x = cmSourceGroup::GetSourceFiles(pcVar7);
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                      (&sFiles,__x);
            for (ppcVar10 = sFiles.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                ppcVar10 !=
                sFiles.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppcVar10 = ppcVar10 + 1) {
              psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar10);
              std::__cxx11::string::string((string *)&fullPath,(string *)psVar6);
              bVar1 = cmsys::SystemTools::FileIsDirectory(&fullPath);
              if (!bVar1) {
                std::__cxx11::string::string((string *)&linkName4,(string *)&source);
                std::__cxx11::string::append((char *)&linkName4);
                cmsys::SystemTools::GetFilenameName(&local_70,&fullPath);
                std::__cxx11::string::append((string *)&linkName4);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::string((string *)&local_70,(string *)&fullPath);
                AppendLinkedResource(fout,&linkName4,&local_70,LinkToFile);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&linkName4);
              }
              std::__cxx11::string::~string((string *)&fullPath);
            }
            std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
            ~_Vector_base(&sFiles.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         );
            std::__cxx11::string::~string((string *)&source);
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&sourceGroups);
        }
      }
      std::__cxx11::string::~string((string *)&linkName2);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&targets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
    pcVar3 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  }
  std::__cxx11::string::~string((string *)&linkName);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const std::vector<cmGeneratorTarget*> targets =
        (*lgIt)->GetGeneratorTargets();

    for(std::vector<cmGeneratorTarget*>::const_iterator ti=targets.begin();
        ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          const char* prefix = ((*ti)->GetType()==cmState::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += (*ti)->GetName();
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(*ti);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           this->GetEclipsePath(fullPath),
                                           LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}